

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainer.h
# Opt level: O2

void __thiscall
chrono::ChContactContainer::
SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<6>>>
          (ChContactContainer *this,
          list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
          *contactlist,
          unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
          *contactforces)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long *plVar7;
  key_type pCVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  iterator iVar15;
  _List_node_base *p_Var16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ChVector<double> force;
  ChVector<double> force_loc;
  ChVector<double> local_128;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  ChVector<double> local_d8;
  undefined1 local_b8 [16];
  double local_a8;
  ulong local_98;
  undefined8 uStack_90;
  double local_88;
  key_type local_80;
  undefined1 local_78 [16];
  undefined8 uStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  p_Var16 = (_List_node_base *)contactlist;
  while (p_Var16 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>_*>_>
                      *)&p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var16 != (_List_node_base *)contactlist) {
    plVar7 = (long *)p_Var16[1]._M_next;
    local_88 = (double)plVar7[0xe];
    local_100 = (double)plVar7[0xf];
    local_108 = (double)plVar7[0xd];
    local_e8 = (double)plVar7[0x10];
    local_110 = (double)plVar7[0x11];
    local_f0 = (double)plVar7[0x12];
    local_98 = plVar7[0x13];
    local_f8 = (double)plVar7[0x14];
    local_e0 = (double)plVar7[0x15];
    (**(code **)(*plVar7 + 0x10))(&local_48);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = local_48;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_38;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_108;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_40 * local_88;
    auVar1 = vfmadd231sd_fma(auVar30,auVar17,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_e8;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_40 * local_110;
    auVar2 = vfmadd231sd_fma(auVar32,auVar17,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_98;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_40 * local_f8;
    auVar3 = vfmadd231sd_fma(auVar22,auVar17,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_100;
    auVar1 = vfmadd231sd_fma(auVar1,auVar27,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_f0;
    auVar2 = vfmadd231sd_fma(auVar2,auVar27,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_e0;
    auVar3 = vfmadd231sd_fma(auVar3,auVar27,auVar6);
    local_128.m_data[0] = auVar1._0_8_;
    local_128.m_data[1] = auVar2._0_8_;
    local_128.m_data[2] = auVar3._0_8_;
    lVar14 = (long)p_Var16[1]._M_next;
    local_e0 = *(double *)(lVar14 + 0x38);
    local_98 = *(undefined8 *)(lVar14 + 0x40);
    uStack_90 = *(undefined8 *)(lVar14 + 0x48);
    local_d8.m_data[2] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    pCVar8 = *(key_type *)(lVar14 + 0x10);
    if (pCVar8 != (key_type)0x0) {
      local_110 = *(double *)(lVar14 + 0x30);
      local_108 = *(double *)(lVar14 + 0x28);
      local_100 = *(double *)(lVar14 + 0x20);
      local_f8 = local_128.m_data[2];
      local_f0 = local_128.m_data[1];
      local_e8 = local_128.m_data[0];
      lVar14 = __dynamic_cast(pCVar8,&ChContactable_1vars<6>::typeinfo,&ChBody::typeinfo,0x170);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_f8;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_f0;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_e8;
      if (lVar14 != 0) {
        dVar9 = local_110 - *(double *)(lVar14 + 0x90);
        dVar10 = local_100 - *(double *)(lVar14 + 0x80);
        dVar11 = local_108 - *(double *)(lVar14 + 0x88);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar11;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = local_f0 * dVar9;
        auVar1 = vfnmadd231sd_fma(auVar31,auVar23,auVar33);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar9;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = local_f8 * dVar10;
        auVar2 = vfnmadd231sd_fma(auVar34,auVar36,auVar28);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar10;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = local_e8 * dVar11;
        auVar3 = vfnmadd231sd_fma(auVar24,auVar18,auVar38);
        local_d8.m_data[0] = auVar1._0_8_;
        local_d8.m_data[1] = auVar2._0_8_;
        local_d8.m_data[2] = auVar3._0_8_;
      }
    }
    local_80 = pCVar8;
    iVar15 = std::
             _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&contactforces->_M_h,&local_80);
    if (iVar15.
        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_80 = *(key_type *)((long)p_Var16[1]._M_next + 0x10);
      auVar19._0_8_ = -local_128.m_data[2];
      auVar19._8_8_ = 0x8000000000000000;
      local_78._8_8_ = -local_128.m_data[1];
      local_78._0_8_ = -local_128.m_data[0];
      uStack_68 = vmovlpd_avx(auVar19);
      dStack_60 = local_d8.m_data[0];
      dStack_58 = local_d8.m_data[1];
      dStack_50 = local_d8.m_data[2];
      std::
      _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<chrono::ChContactable_1vars<6>*,chrono::ChContactContainer::ForceTorque>>
                ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)contactforces,&local_80);
    }
    else {
      ChVector<double>::operator-=
                ((ChVector<double> *)
                 ((long)iVar15.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x10),&local_128);
      ChVector<double>::operator+=
                ((ChVector<double> *)
                 ((long)iVar15.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x28),&local_d8);
    }
    local_a8 = 0.0;
    local_b8 = ZEXT816(0);
    pCVar8 = *(key_type *)((long)p_Var16[1]._M_next + 0x18);
    if (pCVar8 != (key_type)0x0) {
      lVar14 = __dynamic_cast(pCVar8,&ChContactable_1vars<6>::typeinfo,&ChBody::typeinfo,0x170);
      if (lVar14 != 0) {
        auVar13._8_8_ = uStack_90;
        auVar13._0_8_ = local_98;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_128.m_data[0];
        auVar37._8_8_ = local_128.m_data[2];
        auVar37._0_8_ = local_128.m_data[2];
        auVar12._8_8_ = local_128.m_data[2];
        auVar12._0_8_ = local_128.m_data[1];
        auVar2 = vsubpd_avx(auVar13,*(undefined1 (*) [16])(lVar14 + 0x88));
        auVar3 = vunpcklpd_avx(auVar37,auVar25);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_e0 - *(double *)(lVar14 + 0x80);
        auVar1 = vshufpd_avx(auVar2,auVar20,1);
        auVar35._0_8_ = local_128.m_data[1] * auVar1._0_8_;
        auVar35._8_8_ = local_128.m_data[2] * auVar1._8_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_128.m_data[0] * auVar2._0_8_;
        auVar1 = vfmsub231sd_fma(auVar26,auVar20,auVar12);
        local_b8 = vfmsub213pd_fma(auVar3,auVar2,auVar35);
        local_a8 = auVar1._0_8_;
      }
    }
    local_80 = pCVar8;
    iVar15 = std::
             _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&contactforces->_M_h,&local_80);
    if (iVar15.
        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
        ._M_cur == (__node_type *)0x0) {
      auVar21._8_8_ = local_128.m_data[2];
      auVar21._0_8_ = local_128.m_data[2];
      auVar21._16_8_ = local_128.m_data[2];
      auVar21._24_8_ = local_128.m_data[2];
      auVar29._8_8_ = local_b8._0_8_;
      auVar29._0_8_ = local_b8._0_8_;
      auVar29._16_8_ = local_b8._0_8_;
      auVar29._24_8_ = local_b8._0_8_;
      local_80 = *(key_type *)((long)p_Var16[1]._M_next + 0x18);
      auVar21 = vblendpd_avx(ZEXT1632(CONCAT88(local_128.m_data[1],local_128.m_data[0])),auVar21,4);
      _local_78 = vblendpd_avx(auVar21,auVar29,8);
      dStack_58 = (double)local_b8._8_8_;
      dStack_50 = local_a8;
      std::
      _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<chrono::ChContactable_1vars<6>*,chrono::ChContactContainer::ForceTorque>>
                ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)contactforces,&local_80);
    }
    else {
      ChVector<double>::operator+=
                ((ChVector<double> *)
                 ((long)iVar15.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x10),&local_128);
      ChVector<double>::operator+=
                ((ChVector<double> *)
                 ((long)iVar15.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x28),(ChVector<double> *)local_b8);
    }
  }
  return;
}

Assistant:

void SumAllContactForces(std::list<Tcont*>& contactlist,
                             std::unordered_map<ChContactable*, ForceTorque>& contactforces) {
        for (auto contact = contactlist.begin(); contact != contactlist.end(); ++contact) {
            // Extract information for current contact (expressed in global frame)
            ChMatrix33<> A = (*contact)->GetContactPlane();
            ChVector<> force_loc = (*contact)->GetContactForce();
            ChVector<> force = A * force_loc;
            ChVector<> p1 = (*contact)->GetContactP1();
            ChVector<> p2 = (*contact)->GetContactP2();

            // Calculate contact torque for first object (expressed in global frame).
            // Recall that -force is applied to the first object.
            ChVector<> torque1(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjA())) {
                torque1 = Vcross(p1 - body->GetPos(), -force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry1 = contactforces.find((*contact)->GetObjA());
            if (entry1 != contactforces.end()) {
                entry1->second.force -= force;
                entry1->second.torque += torque1;
            } else {
                ForceTorque ft{-force, torque1};
                contactforces.insert(std::make_pair((*contact)->GetObjA(), ft));
            }

            // Calculate contact torque for second object (expressed in global frame).
            // Recall that +force is applied to the second object.
            ChVector<> torque2(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjB())) {
                torque2 = Vcross(p2 - body->GetPos(), force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry2 = contactforces.find((*contact)->GetObjB());
            if (entry2 != contactforces.end()) {
                entry2->second.force += force;
                entry2->second.torque += torque2;
            } else {
                ForceTorque ft{force, torque2};
                contactforces.insert(std::make_pair((*contact)->GetObjB(), ft));
            }
        }
    }